

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_string(xml_allocator *this,size_t length)

{
  xml_allocator *this_00;
  undefined2 *puVar1;
  long in_RSI;
  ptrdiff_t page_offset;
  xml_memory_string_header *header;
  xml_memory_page *page;
  size_t full_size;
  size_t size;
  undefined2 local_48;
  xml_memory_page **in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  char_t *local_8;
  
  this_00 = (xml_allocator *)(in_RSI + 0xbU & 0xfffffffffffffff8);
  puVar1 = (undefined2 *)
           allocate_memory(this_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (puVar1 == (undefined2 *)0x0) {
    local_8 = (char_t *)0x0;
  }
  else {
    *puVar1 = (short)((long)puVar1 + (-0x28 - in_stack_ffffffffffffffd0) >> 3);
    if (this_00 < (xml_allocator *)0x80000) {
      local_48 = (undefined2)((ulong)this_00 >> 3);
    }
    else {
      local_48 = 0;
    }
    puVar1[1] = local_48;
    local_8 = (char_t *)(puVar1 + 2);
  }
  return local_8;
}

Assistant:

char_t* allocate_string(size_t length)
		{
			static const size_t max_encoded_offset = (1 << 16) * xml_memory_block_alignment;

			PUGI__STATIC_ASSERT(xml_memory_page_size <= max_encoded_offset);

			// allocate memory for string and header block
			size_t size = sizeof(xml_memory_string_header) + length * sizeof(char_t);

			// round size up to block alignment boundary
			size_t full_size = (size + (xml_memory_block_alignment - 1)) & ~(xml_memory_block_alignment - 1);

			xml_memory_page* page;
			xml_memory_string_header* header = static_cast<xml_memory_string_header*>(allocate_memory(full_size, page));

			if (!header) return 0;

			// setup header
			ptrdiff_t page_offset = reinterpret_cast<char*>(header) - reinterpret_cast<char*>(page) - sizeof(xml_memory_page);

			assert(page_offset % xml_memory_block_alignment == 0);
			assert(page_offset >= 0 && static_cast<size_t>(page_offset) < max_encoded_offset);
			header->page_offset = static_cast<uint16_t>(static_cast<size_t>(page_offset) / xml_memory_block_alignment);

			// full_size == 0 for large strings that occupy the whole page
			assert(full_size % xml_memory_block_alignment == 0);
			assert(full_size < max_encoded_offset || (page->busy_size == full_size && page_offset == 0));
			header->full_size = static_cast<uint16_t>(full_size < max_encoded_offset ? full_size / xml_memory_block_alignment : 0);

			// round-trip through void* to avoid 'cast increases required alignment of target type' warning
			// header is guaranteed a pointer-sized alignment, which should be enough for char_t
			return static_cast<char_t*>(static_cast<void*>(header + 1));
		}